

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void jsondec_array(jsondec *d,upb_Message *msg,upb_FieldDef *f)

{
  _Bool _Var1;
  upb_MutableMessageValue arr_00;
  undefined1 local_48 [8];
  upb_JsonMessageValue elem;
  upb_Array *arr;
  upb_FieldDef *f_local;
  upb_Message *msg_local;
  jsondec *d_local;
  
  _Var1 = upb_Message_IsFrozen(msg);
  if (_Var1) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x379,"void jsondec_array(jsondec *, upb_Message *, const upb_FieldDef *)");
  }
  arr_00 = upb_Message_Mutable(msg,f,d->arena);
  elem._16_8_ = arr_00;
  jsondec_arrstart(d);
  while (_Var1 = jsondec_arrnext(d), _Var1) {
    jsondec_value((upb_JsonMessageValue *)local_48,d,f);
    if ((elem.value.str_val.size._0_1_ & 1) == 0) {
      upb_Array_Append(arr_00.array,_local_48,d->arena);
    }
  }
  jsondec_arrend(d);
  return;
}

Assistant:

static void jsondec_array(jsondec* d, upb_Message* msg, const upb_FieldDef* f) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  upb_Array* arr = upb_Message_Mutable(msg, f, d->arena).array;

  jsondec_arrstart(d);
  while (jsondec_arrnext(d)) {
    upb_JsonMessageValue elem = jsondec_value(d, f);
    if (!elem.ignore) {
      upb_Array_Append(arr, elem.value, d->arena);
    }
  }
  jsondec_arrend(d);
}